

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::MultisampleCase::renderTriangle
          (MultisampleCase *this,Vec2 *p0,Vec2 *p1,Vec2 *p2,Vec4 *c0,Vec4 *c1,Vec4 *c2)

{
  float fVar1;
  float fVar2;
  Vector<float,_3> local_5c;
  Vector<float,_3> local_50;
  Vector<float,_3> local_44;
  Vec4 *local_38;
  Vec4 *c1_local;
  Vec4 *c0_local;
  Vec2 *p2_local;
  Vec2 *p1_local;
  Vec2 *p0_local;
  MultisampleCase *this_local;
  
  local_38 = c1;
  c1_local = c0;
  c0_local = (Vec4 *)p2;
  p2_local = p1;
  p1_local = p0;
  p0_local = (Vec2 *)this;
  fVar1 = tcu::Vector<float,_2>::x(p0);
  fVar2 = tcu::Vector<float,_2>::y(p1_local);
  tcu::Vector<float,_3>::Vector(&local_44,fVar1,fVar2,0.0);
  fVar1 = tcu::Vector<float,_2>::x(p2_local);
  fVar2 = tcu::Vector<float,_2>::y(p2_local);
  tcu::Vector<float,_3>::Vector(&local_50,fVar1,fVar2,0.0);
  fVar1 = tcu::Vector<float,_2>::x((Vector<float,_2> *)c0_local);
  fVar2 = tcu::Vector<float,_2>::y((Vector<float,_2> *)c0_local);
  tcu::Vector<float,_3>::Vector(&local_5c,fVar1,fVar2,0.0);
  renderTriangle(this,&local_44,&local_50,&local_5c,c1_local,local_38,c2);
  return;
}

Assistant:

void MultisampleCase::renderTriangle (const Vec2& p0, const Vec2& p1, const Vec2& p2, const Vec4& c0, const Vec4& c1, const Vec4& c2) const
{
	renderTriangle(Vec3(p0.x(), p0.y(), 0.0f),
				   Vec3(p1.x(), p1.y(), 0.0f),
				   Vec3(p2.x(), p2.y(), 0.0f),
				   c0, c1, c2);
}